

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::logImage(Image *img,TestLog *log,bool useType)

{
  TestLog *pTVar1;
  char *pcVar2;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLenum local_20;
  byte local_19;
  GLenum type;
  bool useType_local;
  TestLog *log_local;
  Image *img_local;
  
  local_20 = (img->internalFormat).unsizedType;
  local_19 = useType;
  _type = log;
  log_local = (TestLog *)img;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Internal format",&local_41);
  pcVar2 = glu::getTextureFormatName(*(int *)&log_local[1].m_log);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
  logField(log,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pTVar1 = _type;
  if (((local_19 & 1) != 0) && (local_20 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Format type",&local_a1);
    pcVar2 = glu::getTypeName(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar2,&local_c9);
    logField(pTVar1,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  pTVar1 = _type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Width",&local_f1);
  de::toString<int>(&local_118,(int *)(log_local + 2));
  logField(pTVar1,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pTVar1 = _type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Height",&local_139);
  de::toString<int>(&local_160,(int *)((long)&log_local[2].m_log + 4));
  logField(pTVar1,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  return;
}

Assistant:

static void logImage (const Image& img, TestLog& log, bool useType)
{
	const GLenum type = img.internalFormat.unsizedType;
	logField(log, "Internal format",	getTextureFormatName(img.internalFormat.format));
	if (useType && type != GL_NONE)
		logField(log, "Format type",	getTypeName(type));
	logField(log, "Width",				toString(img.width));
	logField(log, "Height",				toString(img.height));
}